

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineLimitTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LimitEllipsisTests::
GlyphIndexAndExtentAreLatchedForTheStyleAtWhichCandidatePositionIsFound(LimitEllipsisTests *this)

{
  pair<unsigned_int,_std::pair<unsigned_int,_float>_> pVar1;
  allocator local_279;
  string local_278;
  LocationInfo local_258;
  char *local_230;
  allocator local_221;
  string local_220;
  LocationInfo local_200;
  allocator local_1d1;
  string local_1d0;
  LocationInfo local_1b0;
  state local_188;
  state referenceTrimmed [1];
  float local_16c;
  uint local_168;
  pair<unsigned_int,_float> local_164;
  uint local_15c;
  state local_158;
  float local_150;
  pair<unsigned_int,_std::pair<unsigned_int,_float>_> local_148;
  float local_134;
  uint local_130;
  pair<unsigned_int,_float> local_12c;
  uint local_124;
  pair<unsigned_int,_std::pair<unsigned_int,_float>_> local_120;
  pair<unsigned_int,_std::pair<unsigned_int,_float>_> local_110;
  float local_fc;
  uint local_f8;
  pair<unsigned_int,_float> local_f4;
  uint local_ec;
  pair<unsigned_int,_std::pair<unsigned_int,_float>_> local_e8;
  undefined1 local_d8 [8];
  pair<unsigned_long,_std::pair<unsigned_int,_float>_> reference [3];
  undefined1 local_94 [8];
  ellipsis e;
  char *i;
  char *end;
  char *begin;
  layout_builder b;
  LimitEllipsisTests *this_local;
  
  b.state = (state)this;
  mocks::layout_builder::layout_builder((layout_builder *)&begin);
  e._28_8_ = anon_var_dwarf_17e87;
  limit::ellipsis::ellipsis((ellipsis *)local_94,50.0,0x2026);
  limit::ellipsis::begin_style<agge::tests::mocks::layout_builder>
            ((ellipsis *)local_94,(layout_builder *)&begin);
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x423528f6;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            ((ellipsis *)local_94,(layout_builder *)&begin,0x17,1.0,(char **)&e._at_symbol.second,
             "oobar","");
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            ((ellipsis *)local_94,(layout_builder *)&begin,0x18,1.0,(char **)&e._at_symbol.second,
             "obar","");
  begin._4_4_ = 0x65;
  b.ellipsis_codepoint = 0x4039999a;
  limit::ellipsis::begin_style<agge::tests::mocks::layout_builder>
            ((ellipsis *)local_94,(layout_builder *)&begin);
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            ((ellipsis *)local_94,(layout_builder *)&begin,0x19,2.8,(char **)&e._at_symbol.second,
             "bar","");
  local_ec = 10;
  local_f8 = 0x17;
  local_fc = 1.0;
  local_f4 = std::make_pair<unsigned_int,float>(&local_f8,&local_fc);
  local_110 = std::make_pair<unsigned_int,std::pair<unsigned_int,float>>(&local_ec,&local_f4);
  local_e8 = local_110;
  std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>::
  pair<unsigned_int,_std::pair<unsigned_int,_float>,_true>
            ((pair<unsigned_long,_std::pair<unsigned_int,_float>_> *)local_d8,&local_e8);
  local_124 = 0xb;
  local_130 = 0x18;
  local_134 = 1.0;
  local_12c = std::make_pair<unsigned_int,float>(&local_130,&local_134);
  local_148 = std::make_pair<unsigned_int,std::pair<unsigned_int,float>>(&local_124,&local_12c);
  local_120 = local_148;
  std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>::
  pair<unsigned_int,_std::pair<unsigned_int,_float>,_true>
            ((pair<unsigned_long,_std::pair<unsigned_int,_float>_> *)&reference[0].second,&local_120
            );
  local_15c = 0xb;
  local_168 = 0x8b;
  local_16c = 3.71;
  local_164 = std::make_pair<unsigned_int,float>(&local_168,&local_16c);
  pVar1 = std::make_pair<unsigned_int,std::pair<unsigned_int,float>>(&local_15c,&local_164);
  local_150 = pVar1.second.second;
  referenceTrimmed[0] = pVar1._0_8_;
  local_158 = referenceTrimmed[0];
  std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>::
  pair<unsigned_int,_std::pair<unsigned_int,_float>,_true>
            ((pair<unsigned_long,_std::pair<unsigned_int,_float>_> *)&reference[1].second,
             (pair<unsigned_int,_std::pair<unsigned_int,_float>_> *)&local_158);
  local_188.extent = 46.29;
  local_188.next = 0xb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_1d1);
  ut::LocationInfo::LocationInfo(&local_1b0,&local_1d0,0x152);
  ut::
  are_equal<std::pair<unsigned_long,std::pair<unsigned_int,float>>,3ul,std::vector<std::pair<unsigned_long,std::pair<unsigned_int,float>>,std::allocator<std::pair<unsigned_long,std::pair<unsigned_int,float>>>>>
            ((pair<unsigned_long,_std::pair<unsigned_int,_float>_> (*) [3])local_d8,
             (vector<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
              *)&b.trimmed_at.
                 super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b0);
  ut::LocationInfo::~LocationInfo(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_221);
  ut::LocationInfo::LocationInfo(&local_200,&local_220,0x153);
  ut::
  are_equal<agge::layout_builder::state,1ul,std::vector<agge::layout_builder::state,std::allocator<agge::layout_builder::state>>>
            ((state (*) [1])&local_188,
             (vector<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_> *)
             &b.ellipsis_symbol.second,&local_200);
  ut::LocationInfo::~LocationInfo(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  local_230 = "bar";
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_279);
  ut::LocationInfo::LocationInfo(&local_258,&local_278,0x154);
  ut::are_equal<char_const*,char_const*>(&local_230,(char **)&e._at_symbol.second,&local_258);
  ut::LocationInfo::~LocationInfo(&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  mocks::layout_builder::~layout_builder((layout_builder *)&begin);
  return;
}

Assistant:

test( GlyphIndexAndExtentAreLatchedForTheStyleAtWhichCandidatePositionIsFound )
			{
				// INIT
				mocks::layout_builder b;
				const char *const begin = "foobar", *const end = begin + 6;
				const char *i = begin;
				limit::ellipsis e(50.0f);

				e.begin_style(b);
				b.state.extent = 50.0f - 4.71f;
				b.state.next = 10;
				e.add_glyph(b, 23, 1.0f, i, begin + 1, end);
				// <- in here the ellipsis will be appended after the trimming
				e.add_glyph(b, 24, 1.0f, i, begin + 2, end);
				b.ellipsis_symbol.first = 101;
				b.ellipsis_symbol.second = 2.9f;
				e.begin_style(b);

				// ACT
				e.add_glyph(b, 25, 2.8f, i, begin + 3, end);

				// ASSERT
				pair<size_t, pair<glyph_index_t, real_t> > reference[] = {
					make_pair(10u, make_pair(23u, 1.0f)),
					make_pair(11u, make_pair(24u, 1.0f)),
					make_pair(11u, make_pair(139u, 3.71f)), // despite the last ellipsis was 101, 2.9f, we set the previous.
				};
				layout_builder::state referenceTrimmed[] = {	{	46.29f, 11u	}	};

				assert_equal(reference, b.appended);
				assert_equal(referenceTrimmed, b.trimmed_at);
				assert_equal(begin + 3, i);
			}